

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

Define * find_macro_arg(IncludeState *state,Define *defines)

{
  uint uVar1;
  char *pcVar2;
  char *__s1;
  long lVar3;
  int iVar4;
  undefined8 uStack_30;
  char *local_28;
  char *sym;
  Define *def;
  Define *defines_local;
  IncludeState *state_local;
  
  sym = (char *)0x0;
  lVar3 = -((ulong)(state->tokenlen + 1) + 0xf & 0xfffffffffffffff0);
  pcVar2 = state->token;
  uVar1 = state->tokenlen;
  local_28 = (char *)((long)&local_28 + lVar3);
  def = defines;
  defines_local = (Define *)state;
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x153312;
  memcpy((char *)((long)&local_28 + lVar3),pcVar2,(ulong)uVar1);
  local_28[(uint)defines_local->paramcount] = '\0';
  sym = (char *)def;
  while( true ) {
    pcVar2 = local_28;
    if (sym == (char *)0x0) {
      return (Define *)0x0;
    }
    if (*(long *)(sym + 0x18) != 0) {
      *(undefined8 *)((long)&uStack_30 + lVar3) = 0x153360;
      __assert_fail("def->parameters == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x1f9,"const Define *find_macro_arg(const IncludeState *, const Define *)");
    }
    if (*(int *)(sym + 0x20) != 0) {
      *(undefined8 *)((long)&uStack_30 + lVar3) = 0x15338b;
      __assert_fail("def->paramcount == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x1fa,"const Define *find_macro_arg(const IncludeState *, const Define *)");
    }
    __s1 = *(char **)sym;
    *(undefined8 *)((long)&uStack_30 + lVar3) = 0x15339b;
    iVar4 = strcmp(__s1,pcVar2);
    if (iVar4 == 0) break;
    sym = *(char **)(sym + 0x28);
  }
  return (Define *)sym;
}

Assistant:

static const Define *find_macro_arg(const IncludeState *state,
                                    const Define *defines)
{
    const Define *def = NULL;
    char *sym = (char *) alloca(state->tokenlen + 1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    for (def = defines; def != NULL; def = def->next)
    {
        assert(def->parameters == NULL);  // args can't have args!
        assert(def->paramcount == 0);  // args can't have args!
        if (strcmp(def->identifier, sym) == 0)
            break;
    } // while

    return def;
}